

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void AddWindowToDrawData(ImGuiWindow *window,int layer)

{
  int *piVar1;
  ImGuiWindow *window_00;
  ImGuiWindow **ppIVar2;
  int i;
  int i_00;
  ImVector<ImGuiWindow_*> *this;
  
  piVar1 = &(GImGui->IO).MetricsRenderWindows;
  *piVar1 = *piVar1 + 1;
  AddDrawListToDrawData((window->Viewport->DrawDataBuilder).Layers + (uint)layer,window->DrawList);
  this = &(window->DC).ChildWindows;
  for (i_00 = 0; i_00 < this->Size; i_00 = i_00 + 1) {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,i_00);
    window_00 = *ppIVar2;
    if ((window_00->Active == true) && (window_00->Hidden == false)) {
      AddWindowToDrawData(window_00,layer);
    }
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImGuiWindow* window, int layer)
{
    ImGuiContext& g = *GImGui;
    g.IO.MetricsRenderWindows++;
    AddDrawListToDrawData(&window->Viewport->DrawDataBuilder.Layers[layer], window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (IsWindowActiveAndVisible(child)) // Clipped children may have been marked not active
            AddWindowToDrawData(child, layer);
    }
}